

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_c.h
# Opt level: O0

void __thiscall
dlib::
queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::remove_any(queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             *this,T *item)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  string *a;
  ostream *poVar4;
  undefined8 uVar5;
  long *in_RDI;
  ostringstream dlib_o_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_fffffffffffffdb0;
  error_type t;
  ostream local_188;
  
  lVar1 = (**(code **)(*in_RDI + 0x40))();
  if (lVar1 == 0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    poVar2 = std::operator<<(&local_188,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb0);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../queue/queue_kernel_c.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void dlib::queue_kernel_c<dlib::queue_kernel_1<std::basic_string<char>>>::remove_any(T &) [queue_base = dlib::queue_kernel_1<std::basic_string<char>>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_188,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"(this->size() > 0)");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_188,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"\tvoid queue::remove_any");
    poVar2 = std::operator<<(poVar2,
                             "\n\tsize() must be greater than zero if something is going to be removed"
                            );
    poVar2 = std::operator<<(poVar2,"\n\tsize(): ");
    uVar3 = (**(code **)(*in_RDI + 0x40))();
    a = (string *)std::ostream::operator<<(poVar2,uVar3);
    t = (error_type)(uVar3 >> 0x20);
    poVar4 = std::operator<<((ostream *)a,"\n\tthis:   ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI);
    std::operator<<(poVar4,"\n");
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::remove_any(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  return;
}

Assistant:

void queue_kernel_c<queue_base>::
    remove_any (
        T& item
    ) 
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (this->size() > 0),
            "\tvoid queue::remove_any"
            << "\n\tsize() must be greater than zero if something is going to be removed"
            << "\n\tsize(): " << this->size() 
            << "\n\tthis:   " << this
            );

        // call the real function
        queue_base::remove_any(item);
    }